

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_2::ViewPortTestCase::test(ViewPortTestCase *this)

{
  StateVerifier *pSVar1;
  TestContext *pTVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  deUint32 dVar7;
  RenderTarget *pRVar8;
  _func_int **pp_Var9;
  int iVar10;
  uint height;
  uint uVar11;
  uint uVar12;
  uint y;
  uint width;
  uint uVar13;
  float fVar14;
  GLfloat viewportBoundsRange [2];
  GLint maxViewportDimensions [2];
  Random rnd;
  float local_60 [3];
  float local_54;
  CallLogWrapper *local_50;
  int local_48 [2];
  deRandom local_40;
  
  deRandom_init(&local_40,0xabcdef);
  local_48[0] = 0;
  local_48[1] = 0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  local_50 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegerv(local_50,0xd3a,local_48);
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_OES_viewport_array");
  bVar6 = true;
  if (!bVar5) {
    bVar6 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_NV_viewport_array");
  }
  if (bVar6 != false) {
    glu::CallLogWrapper::glGetFloatv(local_50,0x825d,local_60);
  }
  pSVar1 = this->m_verifier;
  pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
  pRVar8 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  uVar12 = pRVar8->m_width;
  pRVar8 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  (*pSVar1->_vptr_StateVerifier[3])(pSVar1,pTVar2,0xba2,0,0,(ulong)uVar12,pRVar8->m_height);
  ApiCase::expectError(&this->super_ApiCase,0);
  iVar10 = 0x78;
  do {
    dVar7 = deRandom_getUint32(&local_40);
    uVar12 = dVar7 % 0x1f401 - 64000;
    dVar7 = deRandom_getUint32(&local_40);
    y = dVar7 % 0x1f401 - 64000;
    iVar4 = local_48[0];
    dVar7 = deRandom_getUint32(&local_40);
    width = dVar7 % (iVar4 + 1U);
    iVar4 = local_48[1];
    dVar7 = deRandom_getUint32(&local_40);
    height = dVar7 % (iVar4 + 1U);
    glu::CallLogWrapper::glViewport(local_50,uVar12,y,width,height);
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pSVar1 = this->m_verifier;
    if (bVar6 == false) {
      pp_Var9 = pSVar1->_vptr_StateVerifier;
    }
    else {
      local_54 = local_60[1];
      fVar14 = floorf(local_60[0]);
      uVar13 = (uint)fVar14;
      fVar14 = floorf(local_54);
      uVar11 = (uint)fVar14;
      uVar3 = uVar11;
      if ((int)uVar12 < (int)uVar11) {
        uVar3 = uVar12;
      }
      bVar5 = (int)uVar12 < (int)uVar13;
      uVar12 = uVar3;
      if (bVar5) {
        uVar12 = uVar13;
      }
      if ((int)y < (int)uVar11) {
        uVar11 = y;
      }
      bVar5 = (int)y < (int)uVar13;
      y = uVar11;
      if (bVar5) {
        y = uVar13;
      }
      pp_Var9 = pSVar1->_vptr_StateVerifier;
    }
    (*pp_Var9[3])(pSVar1,pTVar2,0xba2,(ulong)uVar12,(ulong)y,(ulong)width,height);
    ApiCase::expectError(&this->super_ApiCase,0);
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		GLint maxViewportDimensions[2] = {0};
		GLfloat viewportBoundsRange[2] = {0.0f};
		GLboolean hasViewportArray = false;
		glGetIntegerv(GL_MAX_VIEWPORT_DIMS, maxViewportDimensions);
		hasViewportArray = m_context.getContextInfo().isExtensionSupported("GL_OES_viewport_array") ||
						   m_context.getContextInfo().isExtensionSupported("GL_NV_viewport_array");
		if (hasViewportArray)
		{
			glGetFloatv(GL_VIEWPORT_BOUNDS_RANGE, viewportBoundsRange);
		}

		// verify initial value of first two values
		m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT, 0, 0, m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
		expectError(GL_NO_ERROR);

		const int numIterations = 120;
		for (int i = 0; i < numIterations; ++i)
		{
			GLint x			= rnd.getInt(-64000, 64000);
			GLint y			= rnd.getInt(-64000, 64000);
			GLsizei width	= rnd.getInt(0, maxViewportDimensions[0]);
			GLsizei height	= rnd.getInt(0, maxViewportDimensions[1]);

			glViewport(x, y, width, height);

			if (hasViewportArray)
			{
				m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT,
										   de::clamp(x, deFloorFloatToInt32(viewportBoundsRange[0]), deFloorFloatToInt32(viewportBoundsRange[1])),
										   de::clamp(y, deFloorFloatToInt32(viewportBoundsRange[0]), deFloorFloatToInt32(viewportBoundsRange[1])),
										   width, height);
			}
			else
			{
				m_verifier->verifyInteger4(m_testCtx, GL_VIEWPORT, x, y, width, height);
			}

			expectError(GL_NO_ERROR);
		}
	}